

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.hpp
# Opt level: O1

void __thiscall
qclab::qgates::RotationZ<std::complex<float>_>::RotationZ
          (RotationZ<std::complex<float>_> *this,int qubit,rotation_type *rot,bool fixed)

{
  (this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00139b48;
  (this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.qubit_ =
       qubit;
  if (-1 < qubit) {
    (this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.field_0xc
         = fixed;
    (this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
    super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00139e88;
    (this->super_QRotationGate1<std::complex<float>_>).rotation_.angle_ = rot->angle_;
    (this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
    super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00139fb0;
    return;
  }
  __assert_fail("qubit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QGate1.hpp"
                ,0x21,
                "qclab::qgates::QGate1<std::complex<float>>::QGate1(const int) [T = std::complex<float>]"
               );
}

Assistant:

QGate1( const int qubit )
        : qubit_( qubit )
        {
          assert( qubit >= 0 ) ;
        }